

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_ntlm.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  FILE *pFVar9;
  char **ppcVar10;
  uint *puVar11;
  char *pcVar12;
  size_t sVar13;
  ulong uVar14;
  size_t __size;
  long lStack_590;
  ulong local_580;
  size_t size;
  char *local_570;
  char *local_568;
  char *local_560;
  char *type1_output;
  char *type3_input;
  char *type1_input;
  char *type3_output;
  char buf [1024];
  char logfilename [256];
  
  type1_input = (char *)0x0;
  type3_input = (char *)0x0;
  type1_output = (char *)0x0;
  type3_output = (char *)0x0;
  size = 0;
  buf[0] = '\0';
  bVar2 = false;
  local_560 = "unknown";
  local_568 = "unknown";
  local_570 = "unknown";
  iVar4 = 1;
  while (iVar3 = iVar4, iVar3 < argc) {
    pcVar6 = argv[iVar3];
    iVar4 = strcmp("--use-cached-creds",pcVar6);
    if (iVar4 == 0) {
      bVar2 = true;
      iVar4 = iVar3 + 1;
    }
    else {
      iVar4 = strcmp("--helper-protocol",pcVar6);
      if (iVar4 == 0) {
        iVar4 = iVar3 + 1;
        if (iVar4 < argc) {
          local_560 = argv[iVar4];
          iVar4 = iVar3 + 2;
        }
      }
      else {
        iVar4 = strcmp("--username",pcVar6);
        if (iVar4 == 0) {
          iVar4 = iVar3 + 1;
          if (iVar4 < argc) {
            local_568 = argv[iVar4];
            iVar4 = iVar3 + 2;
          }
        }
        else {
          iVar4 = strcmp("--domain",pcVar6);
          if (iVar4 != 0) {
            puts(
                "Usage: fake_ntlm [option]\n --use-cached-creds\n --helper-protocol [protocol]\n --username [username]\n --domain [domain]"
                );
            goto LAB_00105067;
          }
          iVar4 = iVar3 + 1;
          if (iVar4 < argc) {
            local_570 = argv[iVar4];
            iVar4 = iVar3 + 2;
          }
        }
      }
    }
  }
  pcVar6 = getenv("CURL_NTLM_AUTH_TESTNUM");
  if (pcVar6 == (char *)0x0) {
    pcVar6 = "Test number not specified in CURL_NTLM_AUTH_TESTNUM";
  }
  else {
    pcVar7 = (char *)strtol(pcVar6,(char **)logfilename,10);
    sVar8 = strlen(pcVar6);
    if (((char *)logfilename._0_8_ == pcVar6 + sVar8) && (0 < (long)pcVar7)) {
      curl_msnprintf(logfilename,0x100,"log/fake_ntlm%ld.log",pcVar7);
      pcVar6 = "no";
      if (bVar2) {
        pcVar6 = "yes";
      }
      serverlogfile = logfilename;
      logmsg("fake_ntlm (user: %s) (proto: %s) (domain: %s) (cached creds: %s)",local_568,local_560,
             local_570,pcVar6);
      pcVar6 = getenv("CURL_NTLM_AUTH_SRCDIR");
      if (pcVar6 != (char *)0x0) {
        path = pcVar6;
      }
      pcVar6 = test2file((long)pcVar7);
      pFVar9 = fopen64(pcVar6,"rb");
      if (pFVar9 == (FILE *)0x0) {
LAB_00105125:
        puVar11 = (uint *)__errno_location();
        uVar5 = *puVar11;
        pcVar12 = strerror(uVar5);
        logmsg("fopen() failed with error: %d %s",(ulong)uVar5,pcVar12);
        logmsg("Error opening file: %s",pcVar6);
        pcVar6 = "Couldn\'t open test file %ld";
LAB_00105060:
        logmsg(pcVar6,pcVar7);
      }
      else {
        uVar5 = getpart(&type1_input,&size,"ntlm_auth_type1","input",(FILE *)pFVar9);
        fclose(pFVar9);
        if ((uVar5 == 0) && (size != 0)) {
          pFVar9 = fopen64(pcVar6,"rb");
          if (pFVar9 == (FILE *)0x0) goto LAB_00105125;
          size = 0;
          local_570 = pcVar7;
          uVar5 = getpart(&type3_input,&size,"ntlm_auth_type3","input",(FILE *)pFVar9);
          fclose(pFVar9);
          if ((uVar5 == 0) && (size != 0)) {
            do {
              pcVar7 = fgets(buf,0x400,_stdin);
              if (pcVar7 == (char *)0x0) {
                logmsg("Exit");
                return 1;
              }
              iVar4 = strcmp(buf,type1_input);
              pcVar7 = type3_input;
              if (iVar4 == 0) {
                pFVar9 = fopen64(pcVar6,"rb");
                if (pFVar9 == (FILE *)0x0) {
LAB_00104f90:
                  puVar11 = (uint *)__errno_location();
                  uVar5 = *puVar11;
                  pcVar7 = strerror(uVar5);
                  logmsg("fopen() failed with error: %d %s",(ulong)uVar5,pcVar7);
                  logmsg("Error opening file: %s",pcVar6);
                  pcVar6 = "Couldn\'t open test file %ld";
                  pcVar7 = local_570;
                  goto LAB_00105060;
                }
                size = 0;
                uVar5 = getpart(&type1_output,&size,"ntlm_auth_type1","output",(FILE *)pFVar9);
                fclose(pFVar9);
                if ((uVar5 != 0) || (ppcVar10 = &type1_output, size == 0)) {
                  pcVar6 = "getpart() type 1 output failed with error: %d";
                  goto LAB_00105022;
                }
              }
              else {
                sVar8 = strlen(type3_input);
                iVar4 = strncmp(buf,pcVar7,sVar8);
                if (iVar4 != 0) {
                  local_580 = 0;
                  curl_mprintf("Unknown request\n");
                  sVar8 = strlen(buf);
                  if (sVar8 == 0) {
                    __size = 10;
                  }
                  else {
                    local_580 = 7;
                    if (7 < sVar8 >> 1) {
                      local_580 = sVar8 >> 1;
                    }
                    __size = local_580 + sVar8;
                  }
                  pcVar6 = (char *)malloc(__size);
                  if (pcVar6 == (char *)0x0) goto LAB_00105054;
                  if (sVar8 == 0) {
                    curl_msnprintf(pcVar6,__size,"%s","[NOTHING]");
                    goto LAB_00105107;
                  }
                  sVar13 = 0;
                  uVar14 = 0;
                  goto LAB_00105099;
                }
                pFVar9 = fopen64(pcVar6,"rb");
                if (pFVar9 == (FILE *)0x0) goto LAB_00104f90;
                size = 0;
                uVar5 = getpart(&type3_output,&size,"ntlm_auth_type3","output",(FILE *)pFVar9);
                fclose(pFVar9);
                if ((uVar5 != 0) || (ppcVar10 = &type3_output, size == 0)) {
                  pcVar6 = "getpart() type 3 output failed with error: %d";
                  goto LAB_00105022;
                }
              }
              curl_mprintf("%s",*ppcVar10);
              fflush(_stdout);
            } while( true );
          }
          pcVar6 = "getpart() type 3 input failed with error: %d";
        }
        else {
          pcVar6 = "getpart() type 1 input failed with error: %d";
        }
LAB_00105022:
        logmsg(pcVar6,(ulong)uVar5);
      }
      goto LAB_00105067;
    }
    pcVar6 = "Test number not valid in CURL_NTLM_AUTH_TESTNUM";
  }
  curl_mfprintf(_stderr,pcVar6);
LAB_00105067:
  exit(1);
LAB_00105099:
  if (sVar8 != sVar13) {
    pcVar7 = pcVar6;
    if (uVar14 <= __size - 7) goto LAB_001050c7;
    __size = __size + local_580;
    pcVar7 = (char *)realloc(pcVar6,__size);
    if (pcVar7 != (char *)0x0) goto LAB_001050c7;
    free(pcVar6);
LAB_00105054:
    pcVar6 = "OOM formatting invalid input: \'%s\'\n";
    pcVar7 = buf;
    goto LAB_00105060;
  }
  goto LAB_00105102;
LAB_001050c7:
  cVar1 = buf[sVar13];
  if ((byte)(cVar1 + 0x81U) < 0xa2) {
    curl_msnprintf(pcVar7 + uVar14,__size - uVar14,"[0x%02X]",(ulong)(uint)(int)cVar1);
    lStack_590 = 6;
  }
  else {
    pcVar7[uVar14] = cVar1;
    lStack_590 = 1;
  }
  uVar14 = uVar14 + lStack_590;
  sVar13 = sVar13 + 1;
  pcVar6 = pcVar7;
  goto LAB_00105099;
LAB_00105102:
  pcVar6[uVar14] = '\0';
LAB_00105107:
  logmsg("invalid input: \'%s\'\n",pcVar6);
  free(pcVar6);
  goto LAB_00105067;
}

Assistant:

int main(int argc, char *argv[])
{
  char buf[1024];
  char logfilename[256];
  FILE *stream;
  char *filename;
  int error;
  char *type1_input = NULL, *type3_input = NULL;
  char *type1_output = NULL, *type3_output = NULL;
  size_t size = 0;
  long testnum;
  const char *env;
  int arg = 1;
  const char *helper_user = "unknown";
  const char *helper_proto = "unknown";
  const char *helper_domain = "unknown";
  bool use_cached_creds = FALSE;
  char *msgbuf;

  buf[0] = '\0';

  while(argc > arg) {
    if(!strcmp("--use-cached-creds", argv[arg])) {
      use_cached_creds = TRUE;
      arg++;
    }
    else if(!strcmp("--helper-protocol", argv[arg])) {
      arg++;
      if(argc > arg)
        helper_proto = argv[arg++];
    }
    else if(!strcmp("--username", argv[arg])) {
      arg++;
      if(argc > arg)
        helper_user = argv[arg++];
    }
    else if(!strcmp("--domain", argv[arg])) {
      arg++;
      if(argc > arg)
        helper_domain = argv[arg++];
    }
    else {
      puts("Usage: fake_ntlm [option]\n"
           " --use-cached-creds\n"
           " --helper-protocol [protocol]\n"
           " --username [username]\n"
           " --domain [domain]");
      exit(1);
    }
  }

  env = getenv("CURL_NTLM_AUTH_TESTNUM");
  if(env) {
    char *endptr;
    long lnum = strtol(env, &endptr, 10);
    if((endptr != env + strlen(env)) || (lnum < 1L)) {
      fprintf(stderr, "Test number not valid in CURL_NTLM_AUTH_TESTNUM");
      exit(1);
    }
    testnum = lnum;
  }
  else {
    fprintf(stderr, "Test number not specified in CURL_NTLM_AUTH_TESTNUM");
    exit(1);
  }

  /* logmsg cannot be used until this file name is set */
  snprintf(logfilename, sizeof(logfilename), LOGFILE, testnum);
  serverlogfile = logfilename;

  logmsg("fake_ntlm (user: %s) (proto: %s) (domain: %s) (cached creds: %s)",
         helper_user, helper_proto, helper_domain,
         (use_cached_creds) ? "yes" : "no");

  env = getenv("CURL_NTLM_AUTH_SRCDIR");
  if(env) {
    path = env;
  }

  filename = test2file(testnum);
  stream = fopen(filename, "rb");
  if(!stream) {
    error = errno;
    logmsg("fopen() failed with error: %d %s", error, strerror(error));
    logmsg("Error opening file: %s", filename);
    logmsg("Couldn't open test file %ld", testnum);
    exit(1);
  }
  else {
    /* get the ntlm_auth input/output */
    error = getpart(&type1_input, &size, "ntlm_auth_type1", "input", stream);
    fclose(stream);
    if(error || size == 0) {
      logmsg("getpart() type 1 input failed with error: %d", error);
      exit(1);
    }
  }

  stream = fopen(filename, "rb");
  if(!stream) {
    error = errno;
    logmsg("fopen() failed with error: %d %s", error, strerror(error));
    logmsg("Error opening file: %s", filename);
    logmsg("Couldn't open test file %ld", testnum);
    exit(1);
  }
  else {
    size = 0;
    error = getpart(&type3_input, &size, "ntlm_auth_type3", "input", stream);
    fclose(stream);
    if(error || size == 0) {
      logmsg("getpart() type 3 input failed with error: %d", error);
      exit(1);
    }
  }

  while(fgets(buf, sizeof(buf), stdin)) {
    if(strcmp(buf, type1_input) == 0) {
      stream = fopen(filename, "rb");
      if(!stream) {
        error = errno;
        logmsg("fopen() failed with error: %d %s", error, strerror(error));
        logmsg("Error opening file: %s", filename);
        logmsg("Couldn't open test file %ld", testnum);
        exit(1);
      }
      else {
        size = 0;
        error = getpart(&type1_output, &size, "ntlm_auth_type1", "output",
                        stream);
        fclose(stream);
        if(error || size == 0) {
          logmsg("getpart() type 1 output failed with error: %d", error);
          exit(1);
        }
      }
      printf("%s", type1_output);
      fflush(stdout);
    }
    else if(strncmp(buf, type3_input, strlen(type3_input)) == 0) {
      stream = fopen(filename, "rb");
      if(!stream) {
        error = errno;
        logmsg("fopen() failed with error: %d %s", error, strerror(error));
        logmsg("Error opening file: %s", filename);
        logmsg("Couldn't open test file %ld", testnum);
        exit(1);
      }
      else {
        size = 0;
        error = getpart(&type3_output, &size, "ntlm_auth_type3", "output",
                        stream);
        fclose(stream);
        if(error || size == 0) {
          logmsg("getpart() type 3 output failed with error: %d", error);
          exit(1);
        }
      }
      printf("%s", type3_output);
      fflush(stdout);
    }
    else {
      printf("Unknown request\n");
      msgbuf = printable(buf, 0);
      if(msgbuf) {
        logmsg("invalid input: '%s'\n", msgbuf);
        free(msgbuf);
      }
      else
        logmsg("OOM formatting invalid input: '%s'\n", buf);
      exit(1);
    }
  }
  logmsg("Exit");
  return 1;
}